

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5Colset * sqlite3Fts5ParseColsetInvert(Fts5Parse *pParse,Fts5Colset *p)

{
  int iVar1;
  int iVar2;
  Fts5Colset *pFVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = pParse->pConfig->nCol;
  pFVar3 = (Fts5Colset *)sqlite3Fts5MallocZero(&pParse->rc,(long)iVar5 * 4 + 8);
  if (pFVar3 != (Fts5Colset *)0x0) {
    iVar2 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    iVar4 = 0;
    for (; iVar5 != iVar2; iVar2 = iVar2 + 1) {
      if ((iVar4 < p->nCol) && (iVar2 == p->aiCol[iVar4])) {
        iVar4 = iVar4 + 1;
      }
      else {
        iVar1 = pFVar3->nCol;
        pFVar3->nCol = iVar1 + 1;
        pFVar3->aiCol[iVar1] = iVar2;
      }
    }
  }
  sqlite3_free(p);
  return pFVar3;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColsetInvert(Fts5Parse *pParse, Fts5Colset *p){
  Fts5Colset *pRet;
  int nCol = pParse->pConfig->nCol;

  pRet = (Fts5Colset*)sqlite3Fts5MallocZero(&pParse->rc,
      sizeof(Fts5Colset) + sizeof(int)*nCol
  );
  if( pRet ){
    int i;
    int iOld = 0;
    for(i=0; i<nCol; i++){
      if( iOld>=p->nCol || p->aiCol[iOld]!=i ){
        pRet->aiCol[pRet->nCol++] = i;
      }else{
        iOld++;
      }
    }
  }

  sqlite3_free(p);
  return pRet;
}